

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSelectBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *other;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  reference pvVar7;
  pointer pEVar8;
  reference pvVar9;
  undefined8 *puVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LogicalType child_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  element_type *local_88;
  _Alloc_hider _Stack_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  LogicalType local_70;
  LogicalType local_58;
  LogicalType local_40;
  
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_78._M_head_impl =
       (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)&local_90,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_78);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  _Var4._M_head_impl = local_90._M_head_impl;
  local_90._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_90._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_90._M_head_impl + 8))();
  }
  local_90._M_head_impl = (Expression *)0x0;
  if (local_78._M_head_impl != (Expression *)0x0) {
    (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_78._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(&local_40);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
  bVar6 = LogicalType::operator==(&pEVar8->return_type,(LogicalType *)&local_90);
  if (bVar6) {
    LogicalType::~LogicalType((LogicalType *)&local_90);
  }
  else {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    LogicalType::LogicalType(&local_70,UNKNOWN);
    bVar6 = LogicalType::operator==(&pEVar8->return_type,&local_70);
    LogicalType::~LogicalType(&local_70);
    LogicalType::~LogicalType((LogicalType *)&local_90);
    if (!bVar6) {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar7);
      other = &(bound_function->super_BaseScalarFunction).return_type;
      if (other != &pEVar8->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar8->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar8->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar8->return_type).type_info_);
      }
      puVar10 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)&local_90,other);
      goto LAB_0101ae29;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
  pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  _Var5._M_p = _Stack_80._M_p;
  peVar3 = local_88;
  pvVar9->id_ = (LogicalTypeId)local_90._M_head_impl;
  pvVar9->physical_type_ = local_90._M_head_impl._1_1_;
  uVar11 = *(undefined4 *)
            &(pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar12 = *(undefined4 *)
            ((long)&(pvVar9->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar13 = *(undefined4 *)
            &(pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar14 = *(undefined4 *)
            ((long)&(pvVar9->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = (element_type *)0x0;
  _Stack_80._M_p = (pointer)0x0;
  p_Var2 = (pvVar9->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58._0_4_ = uVar11;
    local_58._4_4_ = uVar12;
    local_58.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = uVar13;
    local_58.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = uVar14;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    uVar11 = local_58._0_4_;
    uVar12 = local_58._4_4_;
    uVar13 = local_58.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
    uVar14 = local_58.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
  }
  _Var5._M_p = _Stack_80._M_p;
  local_88 = (element_type *)CONCAT44(uVar12,uVar11);
  _Stack_80._M_p._4_4_ = uVar14;
  _Stack_80._M_p._0_4_ = uVar13;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)&local_90);
  LogicalType::LogicalType((LogicalType *)&local_90,SQLNULL);
  (bound_function->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_90._M_head_impl;
  (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
       local_90._M_head_impl._1_1_;
  peVar3 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_80._M_p;
  local_88 = peVar3;
  _Stack_80._M_p = (pointer)p_Var2;
  LogicalType::~LogicalType((LogicalType *)&local_90);
  puVar10 = (undefined8 *)operator_new(0x20);
  LogicalType::LogicalType
            ((LogicalType *)&local_90,&(bound_function->super_BaseScalarFunction).return_type);
LAB_0101ae29:
  *puVar10 = &PTR__VariableReturnBindData_0243ce10;
  LogicalType::LogicalType((LogicalType *)(puVar10 + 1),(LogicalType *)&local_90);
  LogicalType::~LogicalType((LogicalType *)&local_90);
  *(undefined8 **)this = puVar10;
  LogicalType::~LogicalType(&local_40);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSelectBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	// If the first argument is an array, cast it to a list
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN || arguments[1]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	D_ASSERT(LogicalTypeId::LIST == arguments[0]->return_type.id() ||
	         LogicalTypeId::SQLNULL == arguments[0]->return_type.id());

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}